

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_fast_str_kv.cc
# Opt level: O0

int btree_fast_str_kv_is_inf_key(void *key)

{
  ushort uVar1;
  undefined8 *in_RDI;
  key_len_t _keylen;
  key_len_t inflen;
  key_len_t keylen;
  void *key_ptr;
  ushort local_1c [6];
  undefined8 *local_10;
  int local_4;
  
  local_10 = in_RDI;
  memset(local_1c,0xff,2);
  if (((ushort *)*local_10 == (ushort *)0x0) ||
     (uVar1 = *(ushort *)*local_10, (ushort)(uVar1 >> 8 | uVar1 << 8) != local_1c[0])) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int btree_fast_str_kv_is_inf_key(void *key)
{
    void *key_ptr;
    key_len_t keylen, inflen;
    key_len_t _keylen;

    memset(&inflen, 0xff, sizeof(key_len_t));
    memcpy(&key_ptr, key, sizeof(void *));
    if (key_ptr) {
        memcpy(&_keylen, key_ptr, sizeof(key_len_t));
        keylen = _endian_decode(_keylen);
        if (keylen == inflen) {
            return 1;
        }
    }
    return 0;
}